

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O3

string * __thiscall BMP::getBit_abi_cxx11_(string *__return_storage_ptr__,BMP *this,int a)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  char *pcVar4;
  pointer pcVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (a != 0) {
    do {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      bVar3 = 1 < (uint)a;
      a = a >> 1;
    } while (bVar3);
  }
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  pcVar5 = pcVar2 + (__return_storage_ptr__->_M_string_length - 1);
  if (pcVar2 < pcVar5 && __return_storage_ptr__->_M_string_length != 0) {
    do {
      pcVar4 = pcVar2 + 1;
      cVar1 = *pcVar2;
      *pcVar2 = *pcVar5;
      *pcVar5 = cVar1;
      pcVar5 = pcVar5 + -1;
      pcVar2 = pcVar4;
    } while (pcVar4 < pcVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BMP::getBit(int a)
{
    using namespace std;

    string x = "";
    while ( a != 0 ){
        if ( a & 1 ){
            x += '1';
        }
        else
            x += '0';
        a = a >> 1;

    }

    reverse( x.begin(), x.end() );

    return x;
}